

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

Color __thiscall
Renderer::renderPixel
          (Renderer *this,function<vec3f_(Ray,_Sampler_&)> *func,vec2f *pixelpos,vec2f *pixelsize)

{
  Ray __args;
  int iVar1;
  MT19937Sampler *this_00;
  size_t sVar2;
  vec3f *in_RDX;
  long in_RDI;
  vec3f vVar3;
  Color CVar4;
  Color tres;
  Ray ray;
  vec2f uv;
  Sampler *sampler;
  int i;
  Color res;
  vec2f *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec8;
  float k;
  vec3f *in_stack_fffffffffffffed0;
  MT19937Sampler *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee8;
  MT19937Sampler *this_01;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  vec3f local_a4;
  vec2f local_98;
  vec2f *local_8c [2];
  undefined8 local_7c;
  vec2f local_6c;
  vec2f local_64;
  MT19937Sampler *local_48;
  int local_40;
  vec3f local_3c;
  vec3f *local_28;
  float fVar5;
  
  local_28 = in_RDX;
  vec3f::vec3f(&local_3c);
  for (local_40 = 0; k = (float)((ulong)in_stack_fffffffffffffec8 >> 0x20),
      local_40 < *(int *)(in_RDI + 8); local_40 = local_40 + 1) {
    this_00 = (MT19937Sampler *)operator_new(0x1390);
    this_01 = this_00;
    sVar2 = std::hash<float>::operator()((hash<float> *)in_stack_fffffffffffffed0,k);
    iVar1 = (int)sVar2 << 2;
    std::hash<float>::operator()((hash<float> *)in_stack_fffffffffffffed0,k);
    MT19937Sampler::MT19937Sampler
              (this_00,(uint)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               (int)in_stack_fffffffffffffed8);
    in_stack_fffffffffffffed0 = local_28;
    local_48 = this_00;
    (*(this_00->super_Sampler)._vptr_Sampler[1])();
    local_6c = ::operator*(in_stack_fffffffffffffeb8,(vec2f *)0x13ef92);
    local_98 = ::operator+(in_stack_fffffffffffffeb8,(vec2f *)0x13efad);
    local_64 = local_98;
    (**(code **)**(undefined8 **)(in_RDI + 0x60))
              (local_98.x,local_8c,*(undefined8 **)(in_RDI + 0x60),local_48);
    __args.origin.y = (float)in_stack_ffffffffffffff14;
    __args.origin.x = (float)in_stack_ffffffffffffff10;
    __args.origin.z = (float)(int)in_stack_ffffffffffffff18;
    __args.dir.x = (float)(int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    __args.dir.y = (float)in_stack_ffffffffffffff20;
    __args.dir.z = in_stack_ffffffffffffff24;
    in_stack_fffffffffffffeb8 = local_8c[0];
    in_stack_fffffffffffffec8 = local_7c;
    vVar3 = std::function<vec3f_(Ray,_Sampler_&)>::operator()
                      ((function<vec3f_(Ray,_Sampler_&)> *)this_01,__args,
                       (Sampler *)CONCAT44(iVar1,in_stack_fffffffffffffee8));
    local_a4.z = vVar3.z;
    local_a4._0_8_ = vVar3._0_8_;
    operator+=(&local_3c,&local_a4);
    in_stack_fffffffffffffed8 = local_48;
    if (local_48 != (MT19937Sampler *)0x0) {
      operator_delete(local_48,8);
    }
  }
  vVar3 = operator/(in_stack_fffffffffffffed0,k);
  CVar4.x = vVar3.x;
  CVar4.y = vVar3.y;
  register0x00001240 = vVar3.z;
  return CVar4;
}

Assistant:

Color Renderer::renderPixel(std::function<Color(Ray, Sampler&)> func, const vec2f& pixelpos, const vec2f& pixelsize) {
	Color res;
	for (int i=0; i<nspp; ++i) {
		Sampler* sampler = new MT19937Sampler((std::hash<float>{}(pixelpos.x)<<2)^std::hash<float>{}(PI*pixelpos.y), i);
		vec2f uv = pixelpos + sampler->get2f() * pixelsize;
		Ray ray = camera->sampleray(uv, *sampler);
		Color tres = func(ray, *sampler);
		/*if (norm(tres)<1e8)*/ res += tres;
		delete sampler;
	}
	return res / nspp;
}